

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_utils.cpp
# Opt level: O2

int bidfx_public_api::price::subject::SubjectUtils::BinarySearch
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,string *key)

{
  int iVar1;
  const_reference pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (int)((ulong)((long)(components->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(components->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
  uVar5 = 0;
  while( true ) {
    while( true ) {
      if (iVar3 < (int)uVar5) {
        return ~uVar5;
      }
      uVar4 = iVar3 + uVar5 >> 1 & 0xfffffffe;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(components,(ulong)uVar4);
      iVar1 = std::__cxx11::string::compare((string *)pvVar2);
      if (-1 < iVar1) break;
      uVar5 = uVar4 + 2;
    }
    if (iVar1 == 0) break;
    iVar3 = uVar4 - 2;
  }
  return uVar4;
}

Assistant:

int SubjectUtils::BinarySearch(const std::vector<std::string>* components, const std::string& key)
{
    int low = 0;
    int high = static_cast<int>(components->size() - 1);

    while (low <= high)
    {
        int mid = low + high >> 2 << 1;
        int cmp = components->at(mid).compare(key);

        if (cmp < 0)
        {
            low = mid + 2;
        }
        else if (cmp > 0)
        {
            high = mid - 2;
        }
        else
        {
            return mid;
        }
    }

    return -1 - low;
}